

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O0

Expression __thiscall dynet::GRUBuilder::add_input_impl(GRUBuilder *this,int prev,Expression *x)

{
  float fVar1;
  size_type sVar2;
  Expression *x_00;
  reference pvVar3;
  reference this_00;
  const_reference pvVar4;
  undefined8 *in_RDX;
  Expression *y;
  int in_ESI;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RDI;
  double __x;
  double __x_00;
  Expression EVar5;
  Expression crt;
  Expression nwt_1;
  Expression ght;
  Expression nwt;
  Expression ct;
  Expression rt;
  Expression ft;
  Expression zt;
  bool prev_zero;
  Expression h_tprev;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *vars;
  uint i;
  Expression in;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *ht;
  bool has_initial_state;
  value_type *in_stack_fffffffffffffc18;
  Expression *y_00;
  ComputationGraph *x_01;
  Expression local_3c0;
  undefined8 uStack_3b8;
  Expression *in_stack_fffffffffffffc78;
  ComputationGraph *in_stack_fffffffffffffc80;
  ComputationGraph *local_320;
  VariableIndex local_318;
  uint uStack_314;
  ComputationGraph *local_300;
  undefined8 local_2f8;
  ComputationGraph *local_2e0;
  undefined8 local_2d8;
  ComputationGraph *local_2d0;
  undefined8 local_2c8;
  ComputationGraph *local_2c0;
  undefined8 local_2b8;
  ComputationGraph **local_2b0;
  undefined8 local_2a8;
  Expression local_2a0;
  Expression local_290;
  Expression local_280;
  ComputationGraph *local_270;
  undefined8 local_268;
  ComputationGraph *local_260;
  undefined8 local_258;
  ComputationGraph *local_250;
  undefined8 local_248;
  ComputationGraph *local_240;
  undefined8 local_238;
  ComputationGraph *local_230;
  VariableIndex local_228;
  uint uStack_224;
  ComputationGraph **local_220;
  undefined8 local_218;
  Expression local_210;
  ComputationGraph *local_200;
  undefined8 local_1f8;
  ComputationGraph *local_1f0;
  undefined8 local_1e8;
  ComputationGraph *local_1e0;
  undefined8 local_1d8;
  ComputationGraph **local_1d0;
  undefined8 local_1c8;
  Expression local_1c0;
  Expression local_1b0;
  Expression local_1a0;
  Expression local_190;
  ComputationGraph *local_180;
  undefined8 local_178;
  ComputationGraph *local_170;
  undefined8 local_168;
  ComputationGraph *local_160;
  undefined8 local_158;
  ComputationGraph *local_150;
  undefined8 local_148;
  ComputationGraph *local_140;
  VariableIndex local_138;
  uint uStack_134;
  ComputationGraph **local_130;
  undefined8 local_128;
  Expression local_120;
  ComputationGraph *local_110;
  undefined8 local_108;
  ComputationGraph *local_100;
  undefined8 local_f8;
  ComputationGraph *local_f0;
  undefined8 local_e8;
  ComputationGraph **local_e0;
  undefined8 local_d8;
  Expression local_d0;
  Expression local_c0;
  Expression local_b0;
  byte local_99;
  Expression local_98;
  reference local_88;
  uint local_7c;
  ComputationGraph *local_78;
  undefined8 local_70;
  reference local_68;
  Expression local_49 [2];
  byte local_29;
  undefined8 *local_28;
  int local_1c;
  value_type local_10;
  
  local_28 = in_RDX;
  local_1c = in_ESI;
  sVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                     &in_RDI[0xb].
                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_29 = sVar2 != 0;
  x_00 = (Expression *)
         (ulong)*(uint *)((long)&in_RDI[0xc].
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  y_00 = local_49;
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0x96d446);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)x_01,(size_type)y_00,
             (allocator_type *)x_00);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               *)in_RDI,in_stack_fffffffffffffc18);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)x_00);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0x96d48d);
  local_68 = std::
             vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ::back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                     *)in_RDI);
  local_78 = (ComputationGraph *)*local_28;
  local_70 = local_28[1];
  for (local_7c = 0;
      local_7c <
      *(uint *)((long)&in_RDI[0xc].
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      local_7c = local_7c + 1) {
    local_88 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)(in_RDI + 3),(ulong)local_7c);
    Expression::Expression(&local_98);
    local_99 = 0;
    if ((local_1c < 0) && ((local_29 & 1) == 0)) {
      local_99 = 1;
    }
    else {
      if (local_1c < 0) {
        pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            &in_RDI[0xb].
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_7c);
      }
      else {
        this_00 = std::
                  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                  ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                *)&in_RDI[10].
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1c
                              );
        pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (this_00,(ulong)local_7c);
      }
      local_98.pg = pvVar3->pg;
      local_98.i = pvVar3->i;
      local_98.graph_id = pvVar3->graph_id;
    }
    fVar1 = *(float *)((long)&(in_RDI->
                              super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                              )._M_impl.super__Vector_impl_data._M_finish + 4);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      EVar5 = dropout((Expression *)x_01,(real)((ulong)y_00 >> 0x20));
      local_b0.pg = EVar5.pg;
      local_78 = local_b0.pg;
      local_b0._8_8_ = EVar5._8_8_;
      local_70._0_4_ = local_b0.i;
      local_70._4_4_ = local_b0.graph_id;
      local_b0 = EVar5;
    }
    Expression::Expression(&local_c0);
    if ((local_99 & 1) == 0) {
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,2);
      local_180 = pvVar4->pg;
      local_178._0_4_ = pvVar4->i;
      local_178._4_4_ = pvVar4->graph_id;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,0);
      local_170 = pvVar4->pg;
      local_168._0_4_ = pvVar4->i;
      local_168._4_4_ = pvVar4->graph_id;
      local_160 = local_78;
      local_158 = local_70;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,1);
      local_150 = pvVar4->pg;
      local_148._0_4_ = pvVar4->i;
      local_148._4_4_ = pvVar4->graph_id;
      local_140 = local_98.pg;
      local_138 = local_98.i;
      uStack_134 = local_98.graph_id;
      local_130 = &local_180;
      local_128 = 5;
      EVar5 = affine_transform((initializer_list<dynet::Expression> *)0x96d824);
      local_120.pg = EVar5.pg;
      local_c0.pg = local_120.pg;
      local_120._8_8_ = EVar5._8_8_;
      local_c0.i = local_120.i;
      local_c0.graph_id = local_120.graph_id;
      local_120 = EVar5;
    }
    else {
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,2);
      local_110 = pvVar4->pg;
      local_108._0_4_ = pvVar4->i;
      local_108._4_4_ = pvVar4->graph_id;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,0);
      local_100 = pvVar4->pg;
      local_f8._0_4_ = pvVar4->i;
      local_f8._4_4_ = pvVar4->graph_id;
      local_f0 = local_78;
      local_e8 = local_70;
      local_e0 = &local_110;
      local_d8 = 3;
      EVar5 = affine_transform((initializer_list<dynet::Expression> *)0x96d70c);
      local_d0.pg = EVar5.pg;
      local_c0.pg = local_d0.pg;
      local_d0._8_8_ = EVar5._8_8_;
      local_c0.i = local_d0.i;
      local_c0.graph_id = local_d0.graph_id;
      local_d0 = EVar5;
    }
    EVar5 = logistic(x_00);
    local_190.pg = EVar5.pg;
    local_c0.pg = local_190.pg;
    local_190._8_8_ = EVar5._8_8_;
    local_c0.i = local_190.i;
    local_c0.graph_id = local_190.graph_id;
    local_190 = EVar5;
    local_1a0 = dynet::operator-(local_3c0.pg._4_4_,y_00);
    Expression::Expression(&local_1b0);
    if ((local_99 & 1) == 0) {
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,5);
      local_270 = pvVar4->pg;
      local_268._0_4_ = pvVar4->i;
      local_268._4_4_ = pvVar4->graph_id;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,3);
      local_260 = pvVar4->pg;
      local_258._0_4_ = pvVar4->i;
      local_258._4_4_ = pvVar4->graph_id;
      local_250 = local_78;
      local_248 = local_70;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,4);
      local_240 = pvVar4->pg;
      local_238._0_4_ = pvVar4->i;
      local_238._4_4_ = pvVar4->graph_id;
      local_230 = local_98.pg;
      local_228 = local_98.i;
      uStack_224 = local_98.graph_id;
      local_220 = &local_270;
      local_218 = 5;
      EVar5 = affine_transform((initializer_list<dynet::Expression> *)0x96da85);
      local_210.pg = EVar5.pg;
      local_1b0.pg = local_210.pg;
      local_210._8_8_ = EVar5._8_8_;
      local_1b0.i = local_210.i;
      local_1b0.graph_id = local_210.graph_id;
      local_210 = EVar5;
    }
    else {
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,5);
      local_200 = pvVar4->pg;
      local_1f8._0_4_ = pvVar4->i;
      local_1f8._4_4_ = pvVar4->graph_id;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,3);
      local_1f0 = pvVar4->pg;
      local_1e8._0_4_ = pvVar4->i;
      local_1e8._4_4_ = pvVar4->graph_id;
      local_1e0 = local_78;
      local_1d8 = local_70;
      local_1d0 = &local_200;
      local_1c8 = 3;
      EVar5 = affine_transform((initializer_list<dynet::Expression> *)0x96d96c);
      local_1c0.pg = EVar5.pg;
      local_1b0.pg = local_1c0.pg;
      local_1c0._8_8_ = EVar5._8_8_;
      local_1b0.i = local_1c0.i;
      local_1b0.graph_id = local_1c0.graph_id;
      local_1c0 = EVar5;
    }
    EVar5 = logistic(x_00);
    local_280.pg = EVar5.pg;
    local_1b0.pg = local_280.pg;
    local_280._8_8_ = EVar5._8_8_;
    local_1b0.i = local_280.i;
    local_1b0.graph_id = local_280.graph_id;
    local_280 = EVar5;
    Expression::Expression(&local_290);
    if ((local_99 & 1) == 0) {
      cmult((Expression *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,8);
      in_stack_fffffffffffffc80 = pvVar4->pg;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[](local_88,6);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[](local_88,7);
      EVar5 = affine_transform((initializer_list<dynet::Expression> *)0x96dd80);
      local_320 = EVar5.pg;
      local_290.pg = local_320;
      _local_318 = EVar5._8_8_;
      local_290.i = local_318;
      local_290.graph_id = uStack_314;
      tanh(__x_00);
      in_stack_fffffffffffffc78 = y;
      cmult((Expression *)in_stack_fffffffffffffc80,y);
      cmult((Expression *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      EVar5 = dynet::operator+((Expression *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_68,(ulong)local_7c);
      x_01 = EVar5.pg;
      pvVar3->pg = x_01;
      uStack_3b8 = EVar5._8_8_;
      pvVar3->i = (undefined4)uStack_3b8;
      pvVar3->graph_id = uStack_3b8._4_4_;
      local_78 = pvVar3->pg;
      local_70._0_4_ = pvVar3->i;
      local_70._4_4_ = pvVar3->graph_id;
      local_3c0 = EVar5;
    }
    else {
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,8);
      local_2e0 = pvVar4->pg;
      local_2d8._0_4_ = pvVar4->i;
      local_2d8._4_4_ = pvVar4->graph_id;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,6);
      local_2d0 = pvVar4->pg;
      local_2c8._0_4_ = pvVar4->i;
      local_2c8._4_4_ = pvVar4->graph_id;
      local_2c0 = local_78;
      local_2b8 = local_70;
      local_2b0 = &local_2e0;
      local_2a8 = 3;
      EVar5 = affine_transform((initializer_list<dynet::Expression> *)0x96dba8);
      local_2a0.pg = EVar5.pg;
      local_290.pg = local_2a0.pg;
      local_2a0._8_8_ = EVar5._8_8_;
      local_290.i = local_2a0.i;
      local_290.graph_id = local_2a0.graph_id;
      local_2a0 = EVar5;
      tanh(__x);
      EVar5 = cmult((Expression *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_68,(ulong)local_7c);
      local_300 = EVar5.pg;
      pvVar3->pg = local_300;
      local_2f8 = EVar5._8_8_;
      pvVar3->i = (undefined4)local_2f8;
      pvVar3->graph_id = local_2f8._4_4_;
      local_78 = pvVar3->pg;
      local_70._0_4_ = pvVar3->i;
      local_70._4_4_ = pvVar3->graph_id;
    }
  }
  fVar1 = *(float *)((long)&(in_RDI->
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 4);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::back(in_RDI);
    local_10 = dropout((Expression *)x_01,(real)((ulong)y_00 >> 0x20));
  }
  else {
    pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::back(in_RDI);
    local_10 = *pvVar3;
  }
  EVar5.pg = local_10.pg;
  EVar5.i = local_10.i;
  EVar5.graph_id = local_10.graph_id;
  return EVar5;
}

Assistant:

Expression GRUBuilder::add_input_impl(int prev, const Expression& x) {
  //if(dropout_rate != 0.f)
  //throw std::runtime_error("GRUBuilder doesn't support dropout yet");
  const bool has_initial_state = (h0.size() > 0);
  h.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression h_tprev;
    // prev_zero means that h_tprev should be treated as 0
    bool prev_zero = false;
    if (prev >= 0 || has_initial_state) {
      h_tprev = (prev < 0) ? h0[i] : h[prev][i];
    } else { prev_zero = true; }
    if (dropout_rate) in = dropout(in, dropout_rate);
    // update gate
    Expression zt;
    if (prev_zero)
      zt = affine_transform({vars[BZ], vars[X2Z], in});
    else
      zt = affine_transform({vars[BZ], vars[X2Z], in, vars[H2Z], h_tprev});
    zt = logistic(zt);
    // forget
    Expression ft = 1.f - zt;
    // reset gate
    Expression rt;
    if (prev_zero)
      rt = affine_transform({vars[BR], vars[X2R], in});
    else
      rt = affine_transform({vars[BR], vars[X2R], in, vars[H2R], h_tprev});
    rt = logistic(rt);

    // candidate activation
    Expression ct;
    if (prev_zero) {
      ct = affine_transform({vars[BH], vars[X2H], in});
      ct = tanh(ct);
      Expression nwt = cmult(zt, ct);
      in = ht[i] = nwt;
    } else {
      Expression ght = cmult(rt, h_tprev);
      ct = affine_transform({vars[BH], vars[X2H], in, vars[H2H], ght});
      ct = tanh(ct);
      Expression nwt = cmult(zt, ct);
      Expression crt = cmult(ft, h_tprev);
      in = ht[i] = crt + nwt;
    }
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
  else return ht.back();
}